

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextGLImpl::Flush(DeviceContextGLImpl *this)

{
  string msg;
  BindInfo local_138;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject !=
      (RenderPassGLImpl *)0x0) {
    FormatString<char[54]>
              ((string *)&local_138,
               (char (*) [54])"Flushing device context inside an active render pass.");
    DebugAssertionFailed
              ((Char *)local_138.super_CommittedShaderResources.ResourceCaches._M_elems[0],"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x604);
    std::__cxx11::string::~string((string *)&local_138);
  }
  glFlush();
  memset(&local_138,0,0x124);
  BindInfo::operator=(&this->m_BindInfo,&local_138);
  std::array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>,_8UL>::~array
            (&local_138.super_CommittedShaderResources.SRBs);
  return;
}

Assistant:

void DeviceContextGLImpl::Flush()
{
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Flushing device context inside an active render pass.");

    glFlush();

    m_BindInfo = {};
}